

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O1

void __thiscall CHud::OnMessage(CHud *this,int MsgType,void *pRawMsg)

{
  CGameClient *pCVar1;
  int64 iVar2;
  
  if (MsgType == 5) {
    pCVar1 = (this->super_CComponent).m_pClient;
    if (((pCVar1->m_GameInfo).m_GameFlags & 8) == 0) {
      return;
    }
    if (*(int *)((long)pRawMsg + 4) != pCVar1->m_LocalClientID) {
      return;
    }
    iVar2 = 0;
  }
  else {
    if (MsgType != 0x24) {
      return;
    }
    this->m_CheckpointDiff = *pRawMsg;
    iVar2 = time_get();
  }
  this->m_CheckpointTime = iVar2;
  return;
}

Assistant:

void CHud::OnMessage(int MsgType, void *pRawMsg)
{
	if(MsgType == NETMSGTYPE_SV_CHECKPOINT)
	{
		CNetMsg_Sv_Checkpoint *pMsg = (CNetMsg_Sv_Checkpoint *)pRawMsg;
		m_CheckpointDiff = pMsg->m_Diff;
		m_CheckpointTime = time_get();
	}
	else if(MsgType == NETMSGTYPE_SV_KILLMSG && (m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_RACE))
	{
		// reset checkpoint time on death
		CNetMsg_Sv_KillMsg *pMsg = (CNetMsg_Sv_KillMsg *)pRawMsg;
		if(pMsg->m_Victim == m_pClient->m_LocalClientID)
			m_CheckpointTime = 0;
	}
}